

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_mrope_cache_init
               (float theta_base_t,float theta_base_h,float theta_base_w,float theta_base_e,
               int *sections,bool indep_sects,float freq_scale,float *freq_factors,float *corr_dims,
               int64_t ne0,float ext_factor,float mscale,float *cache,float sin_sign,
               float theta_scale)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  float *sin_theta;
  long i0;
  long lVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int local_80;
  
  iVar1 = *sections;
  iVar2 = sections[1];
  lVar6 = (long)sections[2] + (long)iVar2 + (long)iVar1;
  lVar9 = sections[3] + lVar6;
  if (ne0 < lVar9) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x13b2,"GGML_ASSERT(%s) failed","sect_dims <= ne0");
  }
  if (0 < ne0) {
    sin_theta = cache + 1;
    lVar11 = 0;
    i0 = 0;
    fVar13 = theta_base_t;
    fVar5 = theta_base_h;
    fVar4 = theta_base_w;
    fVar12 = theta_base_e;
    do {
      fVar14 = 1.0;
      if (freq_factors != (float *)0x0) {
        fVar14 = *(float *)((long)freq_factors + i0 * 2);
      }
      lVar8 = lVar11 % lVar9;
      iVar7 = (int)lVar8;
      iVar10 = (int)((long)iVar2 + (long)iVar1);
      fVar17 = fVar4;
      fVar16 = fVar5;
      fVar15 = fVar13;
      if ((((indep_sects) && (fVar15 = theta_base_t, lVar8 != 0)) &&
          (fVar16 = theta_base_h, fVar15 = fVar13, *sections != iVar7)) &&
         (fVar17 = theta_base_w, fVar16 = fVar5, iVar10 != iVar7)) {
        local_80 = (int)lVar6;
        fVar12 = (float)((uint)(local_80 == iVar7) * (int)theta_base_e +
                        (uint)(local_80 != iVar7) * (int)fVar12);
        fVar17 = fVar4;
      }
      if (((iVar10 <= iVar7) || (fVar13 = fVar16, iVar7 < *sections)) &&
         ((iVar7 < iVar10 || (fVar13 = fVar17, sections[2] + iVar10 <= iVar7)))) {
        bVar3 = iVar7 < sections[2] + iVar10;
        fVar13 = (float)((uint)bVar3 * (int)fVar15 + (uint)!bVar3 * (int)fVar12);
      }
      rope_yarn(fVar13 / fVar14,freq_scale,corr_dims,i0,ext_factor,mscale,sin_theta + -1,sin_theta);
      *sin_theta = sin_sign * *sin_theta;
      fVar13 = fVar15 * theta_scale;
      fVar4 = fVar17 * theta_scale;
      fVar5 = fVar16 * theta_scale;
      fVar12 = fVar12 * theta_scale;
      i0 = i0 + 2;
      sin_theta = sin_theta + 2;
      lVar11 = lVar11 + 1;
    } while (i0 < ne0);
  }
  return;
}

Assistant:

static void ggml_mrope_cache_init(
     float theta_base_t, float theta_base_h, float theta_base_w, float theta_base_e, int sections[4], bool indep_sects,
     float freq_scale, const float * freq_factors, float corr_dims[2], int64_t ne0, float ext_factor, float mscale,
     float * cache, float sin_sign, float theta_scale) {
    // ref: https://github.com/jquesnelle/yarn/blob/master/scaled_rope/LlamaYaRNScaledRotaryEmbedding.py
    float theta_t = theta_base_t;
    float theta_h = theta_base_h;
    float theta_w = theta_base_w;
    float theta_e = theta_base_e;  // extra position id for vision encoder
    int sect_dims = sections[0] + sections[1] + sections[2] + sections[3];
    int sec_w = sections[1] + sections[0];
    int sec_e = sections[2] + sec_w;
    GGML_ASSERT(sect_dims <= ne0);

    for (int64_t i0 = 0; i0 < ne0; i0 += 2) {
        const float ff = freq_factors ? freq_factors[i0/2] : 1.0f;

        int sector = (i0 / 2) % sect_dims;
        if (indep_sects) {
            // compute theta independently for each dim sections
            // (i.e. reset corresponding theta when `i0` go from one section to another)
            if (sector == 0) {
                theta_t = theta_base_t;
            }
            else if (sector == sections[0]) {
                theta_h = theta_base_h;;
            }
            else if (sector == sec_w) {
                theta_w = theta_base_w;
            }
            else if (sector == sec_e) {
                theta_e = theta_base_e;
            }
        }

        float theta = theta_t;
        if (sector >= sections[0] && sector < sec_w) {
            theta = theta_h;
        }
        else if (sector >= sec_w && sector < sec_w + sections[2]) {
            theta = theta_w;
        }
        else if (sector >= sec_w + sections[2]) {
            theta = theta_e;
        }

        rope_yarn(
            theta/ff, freq_scale, corr_dims, i0, ext_factor, mscale, &cache[i0 + 0], &cache[i0 + 1]
        );
        cache[i0 + 1] *= sin_sign;

        theta_t *= theta_scale;
        theta_w *= theta_scale;
        theta_h *= theta_scale;
        theta_e *= theta_scale;
    }
}